

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_drawt.cpp
# Opt level: O0

void R_FillColumnHorizP(void)

{
  BYTE BVar1;
  uint uVar2;
  int iVar3;
  uint **ppuVar4;
  uint **span;
  BYTE *pBStack_18;
  int x;
  BYTE *dest;
  BYTE color;
  int count;
  
  iVar3 = dc_count;
  BVar1 = (BYTE)dc_color;
  if (0 < dc_count) {
    uVar2 = dc_x & 3;
    ppuVar4 = dc_ctspan + (int)uVar2;
    **ppuVar4 = dc_yl;
    (*ppuVar4)[1] = dc_yh;
    *ppuVar4 = *ppuVar4 + 2;
    pBStack_18 = dc_temp + (int)(uVar2 + dc_yl * 4);
    if ((iVar3 & 1U) != 0) {
      *pBStack_18 = BVar1;
      pBStack_18 = pBStack_18 + 4;
    }
    for (iVar3 = iVar3 >> 1; iVar3 != 0; iVar3 = iVar3 + -1) {
      *pBStack_18 = BVar1;
      pBStack_18[4] = BVar1;
      pBStack_18 = pBStack_18 + 8;
    }
  }
  return;
}

Assistant:

void R_FillColumnHorizP (void)
{
	int count = dc_count;
	BYTE color = dc_color;
	BYTE *dest;

	if (count <= 0)
		return;

	{
		int x = dc_x & 3;
		unsigned int **span = &dc_ctspan[x];

		(*span)[0] = dc_yl;
		(*span)[1] = dc_yh;
		*span += 2;
		dest = &dc_temp[x + 4*dc_yl];
	}

	if (count & 1) {
		*dest = color;
		dest += 4;
	}
	if (!(count >>= 1))
		return;
	do {
		dest[0] = color; dest[4] = color;
		dest += 8;
	} while (--count);
}